

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_vprintf(fy_emitter *emit,fy_emitter_write_type type,char *fmt,__va_list_tag *ap)

{
  long lVar1;
  int iVar2;
  char *__s;
  undefined8 uStack_60;
  undefined8 uStack_58;
  va_list ap2;
  int size;
  char *str;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_emitter_write_type type_local;
  fy_emitter *emit_local;
  
  ap2[0].overflow_arg_area = ap->reg_save_area;
  uStack_58._0_4_ = ap->gp_offset;
  uStack_58._4_4_ = ap->fp_offset;
  ap2[0]._0_8_ = ap->overflow_arg_area;
  uStack_60 = 0x134c51;
  iVar2 = vsnprintf((char *)0x0,0,fmt,ap);
  if (-1 < iVar2) {
    lVar1 = -((long)iVar2 + 0x10U & 0xfffffffffffffff0);
    __s = (char *)((long)ap2 + lVar1 + -8);
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x134c8f;
    iVar2 = vsnprintf(__s,(long)(iVar2 + 1),fmt,&uStack_58);
    if (-1 < iVar2) {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x134cad;
      fy_emit_write(emit,type,__s,iVar2);
    }
  }
  return;
}

Assistant:

void fy_emit_vprintf(struct fy_emitter *emit, enum fy_emitter_write_type type, const char *fmt, va_list ap) {
    char *str;
    int size;
    va_list ap2;

    va_copy(ap2, ap);

    size = vsnprintf(NULL, 0, fmt, ap);
    if (size < 0)
        return;

    str = alloca(size + 1);
    size = vsnprintf(str, size + 1, fmt, ap2);
    if (size < 0)
        return;

    fy_emit_write(emit, type, str, size);
}